

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::check_collapse_class
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  Alloc *pAVar7;
  bool bVar8;
  sbyte sVar9;
  long lVar10;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar11;
  Int ent_dim;
  long lVar12;
  byte bVar13;
  bool bVar14;
  LO size_in;
  size_t sVar15;
  int *piVar16;
  Read<signed_char> RVar17;
  Write<signed_char> cand_codes_w;
  LOs edge_verts2verts;
  Read<signed_char> edges2class_dim;
  Read<signed_char> verts2class_dim;
  type f;
  Write<signed_char> local_1c8;
  element_type *local_1b0;
  element_type *local_1a8;
  int local_1a0;
  int local_19c;
  string local_198;
  Alloc *local_178;
  element_type *local_170;
  Alloc *local_168;
  element_type *local_160;
  Alloc *local_158;
  element_type *local_150;
  Alloc *local_148;
  element_type *local_140;
  Write<signed_char> local_138;
  Alloc *local_128;
  element_type *local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  element_type *local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  element_type *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  element_type *peStack_f0;
  Alloc *local_e8;
  element_type *peStack_e0;
  Alloc *local_d8;
  element_type *peStack_d0;
  Alloc *local_c8;
  element_type *peStack_c0;
  Alloc *local_b8;
  element_type *peStack_b0;
  Alloc *local_a8;
  element_type *peStack_a0;
  Alloc *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  
  pAVar7 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar7 & 1) == 0) {
    sVar15 = pAVar7->size;
  }
  else {
    sVar15 = (ulong)pAVar7 >> 3;
  }
  paVar2 = &local_198.field_2;
  local_198._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"class_dim","");
  ent_dim = (Int)mesh;
  Mesh::get_array<signed_char>((Mesh *)&local_108,ent_dim,(string *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p,(ulong)(local_198.field_2._M_allocated_capacity + 1))
    ;
  }
  local_198._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"class_dim","");
  Mesh::get_array<signed_char>((Mesh *)&local_118,ent_dim,(string *)0x1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p,(ulong)(local_198.field_2._M_allocated_capacity + 1))
    ;
  }
  Mesh::ask_verts_of((Mesh *)&local_128,ent_dim);
  local_198._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
  size_in = (LO)(sVar15 >> 2);
  Write<signed_char>::Write(&local_1c8,size_in,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar2) {
    operator_delete(local_198._M_dataplus._M_p,(ulong)(local_198.field_2._M_allocated_capacity + 1))
    ;
  }
  local_90._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(cand_codes->write_).shared_alloc_.alloc;
  if (((ulong)local_90._M_pi & 7) == 0 && (Alloc *)local_90._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_90._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_90._M_pi)->use_count = ((Alloc *)local_90._M_pi)->use_count + 1;
    }
  }
  local_1a8 = (element_type *)(cand_codes->write_).shared_alloc_.direct_ptr;
  local_80._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)local_80._M_pi & 7) == 0 && (Alloc *)local_80._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(((Alloc *)local_80._M_pi)->size * 8 + 1)
      ;
    }
    else {
      ((Alloc *)local_80._M_pi)->use_count = ((Alloc *)local_80._M_pi)->use_count + 1;
    }
  }
  local_1b0 = (element_type *)(cands2edges->write_).shared_alloc_.direct_ptr;
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128;
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128->size * 8 + 1);
    }
    else {
      local_128->use_count = local_128->use_count + 1;
    }
  }
  local_68 = local_120;
  local_60._M_pi = local_108._M_pi;
  if (((ulong)local_108._M_pi & 7) == 0 && (Alloc *)local_108._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_108._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_108._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_108._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_58 = local_100;
  local_50._M_pi = local_118._M_pi;
  if (((ulong)local_118._M_pi & 7) == 0 && (Alloc *)local_118._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_118._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_48 = local_110;
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8.shared_alloc_.alloc;
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((local_1c8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_1c8.shared_alloc_.alloc)->use_count = (local_1c8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38 = (element_type *)local_1c8.shared_alloc_.direct_ptr;
  local_f8._M_pi = local_90._M_pi;
  if (((ulong)local_90._M_pi & 7) == 0 && (Alloc *)local_90._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)(local_90._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_90._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_90._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_e8 = (Alloc *)local_80._M_pi;
  if (((ulong)local_80._M_pi & 7) == 0 && (Alloc *)local_80._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e8 = (Alloc *)((long)(local_80._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_80._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_80._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  local_d8 = (Alloc *)local_70._M_pi;
  if (((ulong)local_70._M_pi & 7) == 0 && (Alloc *)local_70._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8 = (Alloc *)((long)(local_70._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_70._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_d0 = local_120;
  local_c8 = (Alloc *)local_60._M_pi;
  if (((ulong)local_60._M_pi & 7) == 0 && (Alloc *)local_60._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)((long)(local_60._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_60._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_60._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_c0 = local_100;
  local_b8 = (Alloc *)local_50._M_pi;
  if (((ulong)local_50._M_pi & 7) == 0 && (Alloc *)local_50._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)((long)(local_50._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_50._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_50._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_b0 = local_110;
  local_a8 = (Alloc *)local_40._M_pi;
  if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)((long)(local_40._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    else {
      *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_40._M_pi[3]._vptr__Sp_counted_base + 1;
    }
  }
  peStack_a0 = (element_type *)local_1c8.shared_alloc_.direct_ptr;
  peStack_f0 = local_1a8;
  peStack_e0 = local_1b0;
  local_88 = local_1a8;
  local_78 = local_1b0;
  if (0 < size_in) {
    local_198._M_dataplus._M_p = (pointer)local_f8._M_pi;
    if (((ulong)local_f8._M_pi & 7) == 0 && (Alloc *)local_f8._M_pi != (Alloc *)0x0) {
      *(int *)&local_f8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_f8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_198._M_dataplus._M_p = (pointer)((long)(local_f8._M_pi)->_vptr__Sp_counted_base * 8 + 1)
      ;
    }
    local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_f0 = (element_type *)0x0;
    local_198.field_2._M_allocated_capacity = (size_type)local_e8;
    if (((ulong)local_e8 & 7) == 0 && local_e8 != (Alloc *)0x0) {
      local_e8->use_count = local_e8->use_count + -1;
      local_198.field_2._M_allocated_capacity = local_e8->size * 8 + 1;
    }
    local_e8 = (Alloc *)0x0;
    peStack_e0 = (element_type *)0x0;
    local_170 = local_120;
    local_178 = local_d8;
    if (((ulong)local_d8 & 7) == 0 && local_d8 != (Alloc *)0x0) {
      local_d8->use_count = local_d8->use_count + -1;
      local_178 = (Alloc *)(local_d8->size * 8 + 1);
    }
    local_d8 = (Alloc *)0x0;
    peStack_d0 = (element_type *)0x0;
    local_160 = local_100;
    local_168 = local_c8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_168 = (Alloc *)(local_c8->size * 8 + 1);
    }
    local_c8 = (Alloc *)0x0;
    peStack_c0 = (element_type *)0x0;
    local_150 = local_110;
    local_158 = local_b8;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_158 = (Alloc *)(local_b8->size * 8 + 1);
    }
    local_b8 = (Alloc *)0x0;
    peStack_b0 = (element_type *)0x0;
    local_140 = (element_type *)local_1c8.shared_alloc_.direct_ptr;
    local_148 = local_a8;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      local_a8->use_count = local_a8->use_count + -1;
      local_148 = (Alloc *)(local_a8->size * 8 + 1);
    }
    local_a8 = (Alloc *)0x0;
    peStack_a0 = (element_type *)0x0;
    entering_parallel = '\0';
    lVar12 = 0;
    do {
      bVar3 = *(byte *)((long)&(local_1a8->super_Graph).a2ab.write_.shared_alloc_.alloc + lVar12);
      lVar10 = (long)*(int *)((long)&(local_1b0->super_Graph).a2ab.write_.shared_alloc_.alloc +
                             lVar12 * 4);
      cVar4 = *(char *)((long)&local_100->library_ +
                       (long)*(int *)(&(((Graph *)&local_120->library_)->a2ab).write_.shared_alloc_.
                                       alloc + lVar10));
      local_19c = (int)cVar4;
      cVar5 = *(char *)((long)&local_100->library_ +
                       (long)*(int *)((long)&(((Graph *)&local_120->library_)->a2ab).write_.
                                             shared_alloc_.alloc + lVar10 * 8 + 4));
      local_1a0 = (int)cVar5;
      cVar6 = *(char *)((long)&(((Graph *)&local_110->library_)->a2ab).write_.shared_alloc_.alloc +
                       lVar10);
      bVar13 = bVar3;
      if (cVar4 == cVar5) {
        if (cVar4 != cVar6) {
          bVar13 = 0;
        }
      }
      else {
        sVar9 = 0;
        piVar16 = &local_19c;
        bVar8 = true;
        do {
          bVar14 = bVar8;
          if (((bVar3 >> sVar9 & 1) != 0) && (*piVar16 != (int)cVar6)) {
            bVar13 = bVar13 & ~(byte)(1 << sVar9);
          }
          sVar9 = 1;
          piVar16 = &local_1a0;
          bVar8 = false;
        } while (bVar14);
      }
      *(byte *)((long)&(((Graph *)local_1c8.shared_alloc_.direct_ptr)->a2ab).write_.shared_alloc_.
                       alloc + lVar12) = bVar13;
      lVar12 = lVar12 + 1;
    } while ((int)lVar12 != size_in);
    local_198._M_string_length = (size_type)local_1a8;
    local_198.field_2._8_8_ = local_1b0;
    local_98 = (Alloc *)this;
    check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_198);
    this = (Omega_h *)local_98;
  }
  check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_f8);
  local_138.shared_alloc_.alloc = local_1c8.shared_alloc_.alloc;
  local_138.shared_alloc_.direct_ptr = local_1c8.shared_alloc_.direct_ptr;
  if ((((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
       local_1c8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_1c8.shared_alloc_.alloc)->use_count = (local_1c8.shared_alloc_.alloc)->use_count + -1;
    local_138.shared_alloc_.alloc = (Alloc *)((local_1c8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_1c8.shared_alloc_.alloc = (Alloc *)0x0;
  local_1c8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_138);
  pAVar7 = local_138.shared_alloc_.alloc;
  if (((ulong)local_138.shared_alloc_.alloc & 7) == 0 &&
      local_138.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar16 = &(local_138.shared_alloc_.alloc)->use_count;
    *piVar16 = *piVar16 + -1;
    if (*piVar16 == 0) {
      Alloc::~Alloc(local_138.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
    }
  }
  check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_90);
  pAVar7 = local_1c8.shared_alloc_.alloc;
  pvVar11 = extraout_RDX;
  if (((ulong)local_1c8.shared_alloc_.alloc & 7) == 0 &&
      local_1c8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar16 = &(local_1c8.shared_alloc_.alloc)->use_count;
    *piVar16 = *piVar16 + -1;
    if (*piVar16 == 0) {
      Alloc::~Alloc(local_1c8.shared_alloc_.alloc);
      operator_delete(pAVar7,0x48);
      pvVar11 = extraout_RDX_00;
    }
  }
  if (((ulong)local_128 & 7) == 0 && local_128 != (Alloc *)0x0) {
    piVar16 = &local_128->use_count;
    *piVar16 = *piVar16 + -1;
    if (*piVar16 == 0) {
      Alloc::~Alloc(local_128);
      operator_delete(local_128,0x48);
      pvVar11 = extraout_RDX_01;
    }
  }
  if (((ulong)local_118._M_pi & 7) == 0 && (Alloc *)local_118._M_pi != (Alloc *)0x0) {
    p_Var1 = local_118._M_pi + 3;
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_118._M_pi);
      operator_delete(local_118._M_pi,0x48);
      pvVar11 = extraout_RDX_02;
    }
  }
  if (((ulong)local_108._M_pi & 7) == 0 && (Alloc *)local_108._M_pi != (Alloc *)0x0) {
    p_Var1 = local_108._M_pi + 3;
    *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc((Alloc *)local_108._M_pi);
      operator_delete(local_108._M_pi,0x48);
      pvVar11 = extraout_RDX_03;
    }
  }
  RVar17.write_.shared_alloc_.direct_ptr = pvVar11;
  RVar17.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar17.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_class(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  auto ncands = cands2edges.size();
  auto verts2class_dim = mesh->get_array<I8>(VERT, "class_dim");
  auto edges2class_dim = mesh->get_array<I8>(EDGE, "class_dim");
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto edge = cands2edges[cand];
    LO eev2v[2];
    for (Int eev = 0; eev < 2; ++eev)
      eev2v[eev] = edge_verts2verts[edge * 2 + eev];
    Int eev_cd[2];
    for (Int eev = 0; eev < 2; ++eev) eev_cd[eev] = verts2class_dim[eev2v[eev]];
    Int e_cd = edges2class_dim[edge];
    /* if both vertices are classified onto the same dimension,
       the edge must also be classified onto that dimension */
    if (eev_cd[0] == eev_cd[1]) {
      if (eev_cd[0] != e_cd) code = DONT_COLLAPSE;
    } else {
      for (Int col_v = 0; col_v < 2; ++col_v) {
        if (collapses(cand_codes[cand], col_v)) {
          /* otherwise, the vertex to collapse and the edge must
             be classified onto the same dimension */
          if (eev_cd[col_v] != e_cd) {
            code = dont_collapse(code, col_v);
          }
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_class");
  return cand_codes_w;
}